

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool DockNodeIsDropAllowedOne(ImGuiWindow *payload,ImGuiWindow *host_window)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindowClass *pIVar3;
  ImGuiPopupData *pIVar4;
  ImGuiWindowClass *local_50;
  ImGuiWindow *popup_window;
  int i;
  ImGuiContext *g;
  ImGuiWindowClass *payload_class;
  ImGuiWindowClass *host_class;
  ImGuiWindow *host_window_local;
  ImGuiWindow *payload_local;
  
  if (((host_window->DockNodeAsHost == (ImGuiDockNode *)0x0) ||
      (bVar2 = ImGuiDockNode::IsDockSpace(host_window->DockNodeAsHost), !bVar2)) ||
     (host_window->BeginOrderWithinContext <= payload->BeginOrderWithinContext)) {
    pIVar1 = GImGui;
    if (host_window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      local_50 = &host_window->WindowClass;
    }
    else {
      local_50 = &host_window->DockNodeAsHost->WindowClass;
    }
    pIVar3 = &payload->WindowClass;
    if (local_50->ClassId == pIVar3->ClassId) {
      popup_window._4_4_ = (GImGui->OpenPopupStack).Size;
      do {
        popup_window._4_4_ = popup_window._4_4_ + -1;
        if (popup_window._4_4_ < 0) {
          return true;
        }
        pIVar4 = ImVector<ImGuiPopupData>::operator[](&pIVar1->OpenPopupStack,popup_window._4_4_);
      } while ((pIVar4->Window == (ImGuiWindow *)0x0) ||
              (bVar2 = ImGui::IsWindowWithinBeginStackOf(payload,pIVar4->Window), !bVar2));
      payload_local._7_1_ = false;
    }
    else if (((local_50->ClassId == 0) || ((local_50->DockingAllowUnclassed & 1U) == 0)) ||
            (pIVar3->ClassId != 0)) {
      if (((pIVar3->ClassId == 0) || (((payload->WindowClass).DockingAllowUnclassed & 1U) == 0)) ||
         (local_50->ClassId != 0)) {
        payload_local._7_1_ = false;
      }
      else {
        payload_local._7_1_ = true;
      }
    }
    else {
      payload_local._7_1_ = true;
    }
  }
  else {
    payload_local._7_1_ = false;
  }
  return payload_local._7_1_;
}

Assistant:

static bool DockNodeIsDropAllowedOne(ImGuiWindow* payload, ImGuiWindow* host_window)
{
    if (host_window->DockNodeAsHost && host_window->DockNodeAsHost->IsDockSpace() && payload->BeginOrderWithinContext < host_window->BeginOrderWithinContext)
        return false;

    ImGuiWindowClass* host_class = host_window->DockNodeAsHost ? &host_window->DockNodeAsHost->WindowClass : &host_window->WindowClass;
    ImGuiWindowClass* payload_class = &payload->WindowClass;
    if (host_class->ClassId != payload_class->ClassId)
    {
        if (host_class->ClassId != 0 && host_class->DockingAllowUnclassed && payload_class->ClassId == 0)
            return true;
        if (payload_class->ClassId != 0 && payload_class->DockingAllowUnclassed && host_class->ClassId == 0)
            return true;
        return false;
    }

    // Prevent docking any window created above a popup
    // Technically we should support it (e.g. in the case of a long-lived modal window that had fancy docking features),
    // by e.g. adding a 'if (!ImGui::IsWindowWithinBeginStackOf(host_window, popup_window))' test.
    // But it would requires more work on our end because the dock host windows is technically created in NewFrame()
    // and our ->ParentXXX and ->RootXXX pointers inside windows are currently mislading or lacking.
    ImGuiContext& g = *GImGui;
    for (int i = g.OpenPopupStack.Size - 1; i >= 0; i--)
        if (ImGuiWindow* popup_window = g.OpenPopupStack[i].Window)
            if (ImGui::IsWindowWithinBeginStackOf(payload, popup_window))   // Payload is created from within a popup begin stack.
                return false;

    return true;
}